

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

void Abc_ConvertAigToBdd_rec2(DdManager *dd,Hop_Obj_t *pObj)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x2ed,"void Abc_ConvertAigToBdd_rec2(DdManager *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 0x14) {
    Abc_ConvertAigToBdd_rec2(dd,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_ConvertAigToBdd_rec2(dd,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    Cudd_RecursiveDeref(dd,(DdNode *)(pObj->field_0).pData);
    (pObj->field_0).pData = (void *)0x0;
    if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
      __assert_fail("Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0x2f4,"void Abc_ConvertAigToBdd_rec2(DdManager *, Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef;
  }
  return;
}

Assistant:

void Abc_ConvertAigToBdd_rec2( DdManager * dd, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToBdd_rec2( dd, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToBdd_rec2( dd, Hop_ObjFanin1(pObj) );
    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    pObj->pData = NULL;
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
}